

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intensity_aperture_solver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar1;
  double *pdVar2;
  int *piVar3;
  EvaluationFunction *ev;
  EvaluationFunction *pEVar4;
  reference pvVar5;
  reference ppSVar6;
  pair<int,_const_char_*> pVar7;
  IntensityILS ils;
  int i_2;
  Plan P;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  EvaluationFunction *F;
  int i_1;
  Station *station;
  vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  int i;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  Collimator collimator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  Help *anon_var_0;
  ParseError *e;
  ValidationError *e_1;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _int0;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  HelpFlag help;
  ArgumentParser parser;
  double maxratio;
  double maxdelta;
  double beta;
  double alpha;
  int max_apertures;
  int maxiter;
  double int0;
  int bsize;
  int vsize;
  undefined4 uVar8;
  uint in_stack_ffffffffffffdf2c;
  undefined4 in_stack_ffffffffffffdf30;
  undefined4 in_stack_ffffffffffffdf34;
  undefined4 in_stack_ffffffffffffdf38;
  int in_stack_ffffffffffffdf3c;
  int in_stack_ffffffffffffdf40;
  int in_stack_ffffffffffffdf44;
  Group *in_stack_ffffffffffffdf48;
  Matcher *in_stack_ffffffffffffdf50;
  string *in_stack_ffffffffffffdf58;
  Station *in_stack_ffffffffffffdf60;
  vector<double,_std::allocator<double>_> *this;
  Group *in_stack_ffffffffffffdf68;
  iterator pdVar9;
  ValueFlag<double,_args::ValueReader<double>_> *in_stack_ffffffffffffdf70;
  undefined1 *puVar10;
  Collimator *in_stack_ffffffffffffdf78;
  value_type in_stack_ffffffffffffdf80;
  value_type in_stack_ffffffffffffdf88;
  char **in_stack_ffffffffffffdf90;
  vector<double,_std::allocator<double>_> *w_00;
  undefined8 in_stack_ffffffffffffdf98;
  int argc_00;
  ArgumentParser *in_stack_ffffffffffffdfa0;
  Plan *this_00;
  undefined4 in_stack_ffffffffffffe000;
  undefined4 in_stack_ffffffffffffe004;
  string *in_stack_ffffffffffffe008;
  int in_stack_ffffffffffffe010;
  int in_stack_ffffffffffffe014;
  Plan *in_stack_ffffffffffffe018;
  ILS *in_stack_ffffffffffffe020;
  int in_stack_ffffffffffffe084;
  int in_stack_ffffffffffffe088;
  int in_stack_ffffffffffffe08c;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_ffffffffffffe090;
  Collimator *in_stack_ffffffffffffe098;
  Station *in_stack_ffffffffffffe0a0;
  int in_stack_ffffffffffffe0b0;
  int in_stack_ffffffffffffe0b8;
  int in_stack_ffffffffffffe0c0;
  int in_stack_ffffffffffffe0c8;
  fstream *in_stack_ffffffffffffe0d0;
  undefined1 ***local_1e38;
  undefined1 ***local_1e18;
  undefined1 ***local_1df8;
  undefined1 ***local_1dd8;
  undefined1 ***local_1db8;
  undefined1 ***local_1d98;
  undefined1 ***local_1d78;
  undefined1 ***local_1d58;
  undefined1 ***local_1d38;
  undefined1 ***local_1d18;
  int local_1c8c;
  undefined1 local_1b69 [33];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe4b8;
  Collimator *in_stack_ffffffffffffe4c0;
  undefined1 local_1b19;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 *local_1af8;
  undefined8 local_1af0;
  undefined1 local_1ac9;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 *local_1aa8;
  undefined8 local_1aa0;
  EvaluationFunction *local_1a80;
  int local_1a74;
  value_type local_1a70;
  undefined1 local_1a61 [25];
  string local_1a48 [100];
  int local_19e4;
  undefined1 local_1809 [40];
  allocator local_17e1;
  string local_17e0 [39];
  allocator local_17b9;
  string local_17b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1798;
  undefined4 local_177c;
  int local_1778;
  char *local_1770;
  undefined4 local_1764;
  int local_1760;
  char *local_1758;
  undefined4 local_174c;
  int local_1748;
  char *local_1740;
  undefined4 local_1734;
  int local_1730;
  char *local_1728;
  undefined4 local_171c;
  int local_1718;
  char *local_1710;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1700;
  undefined4 local_16d4;
  undefined4 local_16c4;
  undefined8 **local_16c0;
  undefined1 **local_16b8 [5];
  undefined8 **local_1690;
  undefined8 local_1688;
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [39];
  allocator local_15a9;
  string local_15a8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1588;
  undefined8 local_14b8;
  undefined8 **local_14b0;
  undefined1 **local_14a8 [5];
  undefined8 **local_1480;
  undefined8 local_1478;
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_1378;
  undefined8 local_12a0;
  undefined8 **local_1298;
  undefined1 **local_1290 [5];
  undefined8 **local_1268;
  undefined8 local_1260;
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [39];
  allocator local_1181;
  string local_1180 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_1160;
  undefined4 local_1084;
  undefined8 **local_1080;
  undefined1 **local_1078 [5];
  undefined8 **local_1050;
  undefined8 local_1048;
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [39];
  allocator local_f69;
  string local_f68 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_f48;
  undefined4 local_e74;
  undefined8 **local_e70;
  undefined1 **local_e68 [5];
  undefined8 **local_e40;
  undefined8 local_e38;
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [39];
  allocator local_d59;
  string local_d58 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_d38;
  undefined4 local_c64;
  undefined8 **local_c60;
  undefined1 **local_c58 [5];
  undefined8 **local_c30;
  undefined8 local_c28;
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [39];
  allocator local_b49;
  string local_b48 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_b28;
  undefined4 local_a54;
  undefined8 **local_a50;
  undefined1 **local_a48 [5];
  undefined8 **local_a20;
  undefined8 local_a18;
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [39];
  allocator local_939;
  string local_938 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_918;
  undefined4 local_844;
  undefined8 **local_840;
  undefined1 **local_838 [5];
  undefined8 **local_810;
  undefined8 local_808;
  string local_790 [32];
  string local_770 [32];
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_708;
  undefined4 local_634;
  undefined8 **local_630;
  undefined1 **local_628 [5];
  undefined8 **local_600;
  undefined8 local_5f8;
  string local_580 [32];
  string local_560 [32];
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_4f8;
  undefined8 **local_428;
  undefined1 **local_420 [5];
  undefined1 local_3f8 [40];
  undefined8 **local_3d0;
  undefined8 local_3c8;
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [239];
  allocator local_231;
  string local_230 [55];
  allocator local_1f9;
  string local_1f8 [432];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  double local_20;
  int local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x14;
  local_18 = 5;
  local_20 = 4.0;
  local_24 = 100;
  local_28 = 4;
  local_30 = 1.0;
  local_38 = 1.0;
  local_40 = 5.0;
  local_48 = 3.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,"********* IMRT-Solver (Intensity-aperture solver) *********",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,
             "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4"
             ,&local_231);
  args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010),
             in_stack_ffffffffffffe008,
             (string *)CONCAT44(in_stack_ffffffffffffe004,in_stack_ffffffffffffe000));
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"help",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"Display this help menu",&local_349);
  local_428 = local_420;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (char)(in_stack_ffffffffffffdf2c >> 0x18));
  local_428 = (undefined8 **)local_3f8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_3d0 = local_420;
  local_3c8 = 2;
  in._M_len = (size_type)in_stack_ffffffffffffdf70;
  in._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,
             (string *)CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40),
             (string *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
             (Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1d18 = (undefined1 ***)&local_3d0;
  do {
    local_1d18 = local_1d18 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107622);
  } while (local_1d18 != local_420);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"int",&local_519);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffdf78 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_630 = local_628;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_600 = local_628;
  local_5f8 = 1;
  in_00._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_00._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_00);
  local_634 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1d38 = (undefined1 ***)&local_600;
  do {
    local_1d38 = local_1d38 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1077de);
  } while (local_1d38 != local_628);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"int",&local_729);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffdf78 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_840 = local_838;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_810 = local_838;
  local_808 = 1;
  in_01._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_01._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_01);
  local_844 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1d58 = (undefined1 ***)&local_810;
  do {
    local_1d58 = local_1d58 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1079a7);
  } while (local_1d58 != local_838);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_770);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"int",&local_939);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_a50 = local_a48;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_a20 = local_a48;
  local_a18 = 1;
  in_02._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_02._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_02);
  local_a54 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1d78 = (undefined1 ***)&local_a20;
  do {
    local_1d78 = local_1d78 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107b72);
  } while (local_1d78 != local_a48);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_9a0);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"int",&local_b49);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffdf78 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_c60 = local_c58;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_c30 = local_c58;
  local_c28 = 1;
  in_03._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_03._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_03);
  local_c64 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1d98 = (undefined1 ***)&local_c30;
  do {
    local_1d98 = local_1d98 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107d3b);
  } while (local_1d98 != local_c58);
  std::__cxx11::string::~string(local_b70);
  std::__cxx11::string::~string(local_b90);
  std::__cxx11::string::~string(local_bb0);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,"int",&local_d59);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_e70 = local_e68;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_e40 = local_e68;
  local_e38 = 1;
  in_04._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_04._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_04);
  local_e74 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1db8 = (undefined1 ***)&local_e40;
  do {
    local_1db8 = local_1db8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107f06);
  } while (local_1db8 != local_e68);
  std::__cxx11::string::~string(local_d80);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string(local_dc0);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f68,"int",&local_f69);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1080 = local_1078;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_1050 = local_1078;
  local_1048 = 1;
  in_05._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_05._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_05);
  local_1084 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1dd8 = (undefined1 ***)&local_1050;
  do {
    local_1dd8 = local_1dd8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1080d1);
  } while (local_1dd8 != local_1078);
  std::__cxx11::string::~string(local_f90);
  std::__cxx11::string::~string(local_fb0);
  std::__cxx11::string::~string(local_fd0);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1180,"double",&local_1181);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1298 = local_1290;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_1268 = local_1290;
  local_1260 = 1;
  in_06._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_06._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_06);
  local_12a0 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60
             ,in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf50,
             (double *)in_stack_ffffffffffffdf48,SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1df8 = (undefined1 ***)&local_1268;
  do {
    local_1df8 = local_1df8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10829d);
  } while (local_1df8 != local_1290);
  std::__cxx11::string::~string(local_11a8);
  std::__cxx11::string::~string(local_11c8);
  std::__cxx11::string::~string(local_11e8);
  std::__cxx11::string::~string(local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"double",&local_1399);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_14b0 = local_14a8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_1480 = local_14a8;
  local_1478 = 1;
  in_07._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_07._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_07);
  local_14b8 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (in_stack_ffffffffffffdf70,in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60
             ,in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf50,
             (double *)in_stack_ffffffffffffdf48,SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1e18 = (undefined1 ***)&local_1480;
  do {
    local_1e18 = local_1e18 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108469);
  } while (local_1e18 != local_14a8);
  std::__cxx11::string::~string(local_13c0);
  std::__cxx11::string::~string(local_13e0);
  std::__cxx11::string::~string(local_1400);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15a8,"int",&local_15a9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffdf78 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
                 (char *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_16c0 = local_16b8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffdf60,(char *)in_stack_ffffffffffffdf58);
  local_1690 = local_16b8;
  local_1688 = 1;
  in_08._M_len = (size_type)in_stack_ffffffffffffdf70;
  in_08._M_array = (iterator)in_stack_ffffffffffffdf68;
  args::Matcher::Matcher((Matcher *)in_stack_ffffffffffffdf60,in_08);
  local_16c4 = 0;
  uVar8 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffdf70,
             in_stack_ffffffffffffdf68,(string *)in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf58
             ,in_stack_ffffffffffffdf50,(int *)in_stack_ffffffffffffdf48,
             SUB41((uint)in_stack_ffffffffffffdf44 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  local_1e38 = (undefined1 ***)&local_1690;
  do {
    local_1e38 = local_1e38 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108632);
    argc_00 = (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20);
  } while (local_1e38 != local_16b8);
  std::__cxx11::string::~string(local_15d0);
  std::__cxx11::string::~string(local_15f0);
  std::__cxx11::string::~string(local_1610);
  std::__cxx11::string::~string(local_15a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
  args::ArgumentParser::ParseCLI(in_stack_ffffffffffffdfa0,argc_00,in_stack_ffffffffffffdf90);
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10997d);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_4f8);
    local_18 = *piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x1099a6);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_708);
    local_14 = *piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x1099cf);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_d38);
    local_40 = (double)*piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x1099fc);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_f48);
    local_48 = (double)*piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x109a29);
  if (bVar1) {
    pdVar2 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_1160);
    local_30 = *pdVar2;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x109a56);
  if (bVar1) {
    pdVar2 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_1378);
    local_38 = *pdVar2;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x109a83);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_918);
    local_20 = (double)*piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x109ab0);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1588);
    local_24 = *piVar3;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x109ad9);
  if (bVar1) {
    piVar3 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_b28);
    local_28 = *piVar3;
  }
  std::
  allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x109b0a);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_ffffffffffffdf50,(size_type)in_stack_ffffffffffffdf48,
           (allocator_type *)CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::
  allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x109b33);
  local_171c = 0;
  pVar7 = std::make_pair<int,char_const(&)[41]>
                    ((int *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
                     (char (*) [41])CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1710 = pVar7.second;
  local_1718 = pVar7.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_1700,0);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (pair<int,_const_char_*> *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1734 = 0x46;
  pVar7 = std::make_pair<int,char_const(&)[42]>
                    ((int *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
                     (char (*) [42])CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1728 = pVar7.second;
  local_1730 = pVar7.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_1700,1);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (pair<int,_const_char_*> *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_174c = 0x8c;
  pVar7 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
                     (char (*) [43])CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1740 = pVar7.second;
  local_1748 = pVar7.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_1700,2);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (pair<int,_const_char_*> *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1764 = 0xd2;
  pVar7 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
                     (char (*) [43])CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1758 = pVar7.second;
  local_1760 = pVar7.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_1700,3);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (pair<int,_const_char_*> *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_177c = 0x118;
  pVar7 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
                     (char (*) [43])CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  local_1770 = pVar7.second;
  local_1778 = pVar7.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_1700,4);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (pair<int,_const_char_*> *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x109d79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b8,"data/CERR_Prostate/DAO_DDM_BLADDER.dat",&local_17b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
              (value_type *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  std::__cxx11::string::~string(local_17b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17e0,"data/CERR_Prostate/DAO_DDM_RECTUM.dat",&local_17e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
              (value_type *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  std::__cxx11::string::~string(local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  this_00 = (Plan *)local_1809;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1809 + 1),"data/CERR_Prostate/DAO_DDM_PTVHD.dat",(allocator *)this_00)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
              (value_type *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  std::__cxx11::string::~string((string *)(local_1809 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1809);
  imrt::Collimator::Collimator(in_stack_ffffffffffffe4c0,in_stack_ffffffffffffe4b8);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)0x109ec3);
  local_19e4 = 0;
  while( true ) {
    ev = (EvaluationFunction *)(long)local_19e4;
    pEVar4 = (EvaluationFunction *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_1798);
    if (pEVar4 <= ev) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1798,(long)local_19e4);
    std::__cxx11::string::string(local_1a48,(string *)pvVar5);
    imrt::Volume::Volume
              ((Volume *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78,
               (string *)in_stack_ffffffffffffdf70);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::push_back
              ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
               CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
               (value_type *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
    imrt::Volume::~Volume((Volume *)0x109f63);
    std::__cxx11::string::~string(local_1a48);
    local_19e4 = local_19e4 + 1;
  }
  w_00 = (vector<double,_std::allocator<double>_> *)local_1a61;
  std::allocator<imrt::Station_*>::allocator((allocator<imrt::Station_*> *)0x10a12d);
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::vector
            ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)in_stack_ffffffffffffdf50,
             (size_type)in_stack_ffffffffffffdf48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::allocator<imrt::Station_*>::~allocator((allocator<imrt::Station_*> *)0x10a153);
  for (local_1a74 = 0; local_1a74 < 5; local_1a74 = local_1a74 + 1) {
    in_stack_ffffffffffffdf88 = (value_type)operator_new(0x170);
    in_stack_ffffffffffffdf48 = (Group *)0x0;
    in_stack_ffffffffffffdf40 = 6;
    in_stack_ffffffffffffdf38 = 0xffffffff;
    in_stack_ffffffffffffdf30 = 2;
    uVar8 = 0;
    imrt::Station::Station
              (in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,in_stack_ffffffffffffe090,
               in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088,in_stack_ffffffffffffe084,
               in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0c0,
               in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0d0);
    local_1a70 = in_stack_ffffffffffffdf88;
    imrt::Station::setUniformIntensity(in_stack_ffffffffffffdf60,(double)in_stack_ffffffffffffdf58);
    imrt::Station::printIntensity
              (in_stack_ffffffffffffdf60,SUB81((ulong)in_stack_ffffffffffffdf58 >> 0x38,0));
    in_stack_ffffffffffffdf80 = local_1a70;
    ppSVar6 = std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::operator[]
                        ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                         (local_1a61 + 1),(long)local_1a74);
    *ppSVar6 = in_stack_ffffffffffffdf80;
  }
  pEVar4 = imrt::EvaluationFunction::getInstance
                     ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
                      CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40),
                      (Collimator *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38));
  local_1ab8 = 0x3ff0000000000000;
  local_1ac8 = 0x3ff0000000000000;
  uStack_1ac0 = 0x3ff0000000000000;
  local_1aa8 = &local_1ac8;
  local_1aa0 = 3;
  puVar10 = &local_1ac9;
  local_1a80 = pEVar4;
  std::allocator<double>::allocator((allocator<double> *)0x10a327);
  __l._M_len = (size_type)puVar10;
  __l._M_array = (iterator)in_stack_ffffffffffffdf68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf60,__l,
             (allocator_type *)in_stack_ffffffffffffdf58);
  std::allocator<double>::~allocator((allocator<double> *)0x10a358);
  local_1b08 = 0x4053000000000000;
  local_1b18 = 0;
  uStack_1b10 = 0;
  local_1af8 = &local_1b18;
  local_1af0 = 3;
  pdVar9 = (iterator)&local_1b19;
  std::allocator<double>::allocator((allocator<double> *)0x10a3a7);
  __l_00._M_len = (size_type)puVar10;
  __l_00._M_array = pdVar9;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf60,__l_00,
             (allocator_type *)in_stack_ffffffffffffdf58);
  std::allocator<double>::~allocator((allocator<double> *)0x10a3d8);
  local_1b69._17_8_ = 0x408f400000000000;
  local_1b69._1_8_ = 0x4050400000000000;
  local_1b69._9_8_ = 0x404e000000000000;
  this = (vector<double,_std::allocator<double>_> *)local_1b69;
  std::allocator<double>::allocator((allocator<double> *)0x10a427);
  __l_01._M_len = (size_type)puVar10;
  __l_01._M_array = pdVar9;
  std::vector<double,_std::allocator<double>_>::vector
            (this,__l_01,(allocator_type *)in_stack_ffffffffffffdf58);
  std::allocator<double>::~allocator((allocator<double> *)0x10a458);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf80,
             (vector<double,_std::allocator<double>_> *)pEVar4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf80,
             (vector<double,_std::allocator<double>_> *)pEVar4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf80,
             (vector<double,_std::allocator<double>_> *)pEVar4);
  imrt::Plan::Plan(this_00,ev,w_00,
                   (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf88,
                   (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdf80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  for (local_1c8c = 0; local_1c8c < 5; local_1c8c = local_1c8c + 1) {
    std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::operator[]
              ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)(local_1a61 + 1),
               (long)local_1c8c);
    imrt::Plan::add_station
              ((Plan *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
               (Station *)CONCAT44(in_stack_ffffffffffffdf2c,uVar8));
  }
  imrt::IntensityILS::IntensityILS
            ((IntensityILS *)in_stack_ffffffffffffdf50,
             (int)((ulong)in_stack_ffffffffffffdf48 >> 0x20),(int)in_stack_ffffffffffffdf48,
             in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf3c,
             (double)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30),
             (double)((ulong)in_stack_ffffffffffffdf2c << 0x20),(int)this);
  imrt::ILS::beamTargetedSearch
            (in_stack_ffffffffffffe020,in_stack_ffffffffffffe018,in_stack_ffffffffffffe014,
             in_stack_ffffffffffffe010);
  system("python plotter/plot.py");
  local_4 = 0;
  local_16d4 = 1;
  imrt::IntensityILS::~IntensityILS((IntensityILS *)0x10a707);
  imrt::Plan::~Plan((Plan *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~vector
            ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
             CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  imrt::Collimator::~Collimator
            ((Collimator *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40));
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a829);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x10a836);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x10a843);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a850);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a85d);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a86a);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a877);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a884);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10a891);
  args::HelpFlag::~HelpFlag((HelpFlag *)0x10a89e);
  args::ArgumentParser::~ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_ffffffffffffdf34,in_stack_ffffffffffffdf30));
  return local_4;
}

Assistant:

int main(int argc, char** argv){

  int vsize=20;
  int bsize=5;
  double int0=4.0;
  int maxiter=100;
  int max_apertures=4;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

	args::ArgumentParser parser("********* IMRT-Solver (Intensity-aperture solver) *********", "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max_ap"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"max_iter"});

	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	//args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_int0) int0=_int0.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, max_apertures);
    station->setUniformIntensity(int0);
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
  // Plan P(F);

	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,76};
	vector<double> Zmax={65,60,1000};

	Plan P(F, w, Zmin, Zmax);
	for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);

	IntensityILS ils(1, bsize, vsize, maxdelta, maxratio, alpha, beta);
	ils.beamTargetedSearch(P,1000,maxiter);


   system("python plotter/plot.py");

	return 0;

}